

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O2

void __thiscall CCommandManager::CCommandManager(CCommandManager *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::init
            (&this->m_aCommands,in_RSI);
  this->m_pConsole = (IConsole *)0x0;
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
            (&this->m_aCommands);
  return;
}

Assistant:

CCommandManager()
    {
        m_pConsole = 0;
        m_aCommands.clear();
    }